

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void __thiscall CaDiCaL::Solver::disconnect_learner(Solver *this)

{
  char *__ptr;
  size_t sStack_10;
  
  require_solver_pointer_to_be_non_zero
            (this,"void CaDiCaL::Solver::disconnect_learner()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
            );
  if (this->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "void CaDiCaL::Solver::disconnect_learner()",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "external solver not initialized";
  }
  else {
    if (this->internal != (Internal *)0x0) {
      if ((this->_state & VALID) != 0) {
        this->external->learner = (Learner *)0x0;
        return;
      }
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
              "void CaDiCaL::Solver::disconnect_learner()",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      __ptr = "solver in invalid state";
      sStack_10 = 0x17;
      goto LAB_006878b6;
    }
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "void CaDiCaL::Solver::disconnect_learner()",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "internal solver not initialized";
  }
  sStack_10 = 0x1f;
LAB_006878b6:
  fwrite(__ptr,sStack_10,1,_stderr);
  fputc(10,_stderr);
  fflush(_stderr);
  abort();
}

Assistant:

void Solver::disconnect_learner () {
  LOG_API_CALL_BEGIN ("disconnect_learner");
  REQUIRE_VALID_STATE ();
#ifdef LOGGING
  if (external->learner)
    LOG ("disconnecting previous learner");
  else
    LOG ("ignoring to disconnect learner (no previous one)");
#endif
  external->learner = 0;
  LOG_API_CALL_END ("disconnect_learner");
}